

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42parse.c
# Opt level: O3

void t42_parse_font_matrix(T42_Face face,T42_Loader loader)

{
  FT_Bool FVar1;
  FT_Int FVar2;
  long b_;
  undefined1 auVar3 [16];
  FT_Fixed temp [6];
  FT_Long local_58;
  FT_Long local_50;
  FT_Long FStack_48;
  long local_40;
  FT_Long local_38;
  FT_Long FStack_30;
  
  FVar2 = (*(loader->parser).root.funcs.to_fixed_array)((PS_Parser)loader,6,&local_58,0);
  if (5 < FVar2) {
    b_ = -local_40;
    if (0 < local_40) {
      b_ = local_40;
    }
    if (local_40 != 0) {
      if (b_ != 0x10000) {
        local_58 = FT_DivFix(local_58,b_);
        local_50 = FT_DivFix(local_50,b_);
        FStack_48 = FT_DivFix(FStack_48,b_);
        local_38 = FT_DivFix(local_38,b_);
        FStack_30 = FT_DivFix(FStack_30,b_);
        local_40 = (ulong)(-1 < local_40) * 0x20000 + -0x10000;
      }
      (face->type1).font_matrix.xx = local_58;
      auVar3._8_4_ = (int)local_50;
      auVar3._0_8_ = FStack_48;
      auVar3._12_4_ = (int)((ulong)local_50 >> 0x20);
      (face->type1).font_matrix.xy = FStack_48;
      (face->type1).font_matrix.yx = auVar3._8_8_;
      (face->type1).font_matrix.yy = local_40;
      FVar1 = FT_Matrix_Check(&(face->type1).font_matrix);
      if (FVar1 != '\0') {
        (face->type1).font_offset.x =
             CONCAT44((int)(local_38 >> 0x30),(int)((ulong)local_38 >> 0x10));
        *(int *)&(face->type1).font_bbox.xMin = (int)((ulong)FStack_30 >> 0x10);
        *(int *)((long)&(face->type1).font_bbox.xMin + 4) = (int)(FStack_30 >> 0x30);
        return;
      }
    }
  }
  (loader->parser).root.error = 3;
  return;
}

Assistant:

static void
  t42_parse_font_matrix( T42_Face    face,
                         T42_Loader  loader )
  {
    T42_Parser  parser = &loader->parser;
    FT_Matrix*  matrix = &face->type1.font_matrix;
    FT_Vector*  offset = &face->type1.font_offset;
    FT_Fixed    temp[6];
    FT_Fixed    temp_scale;
    FT_Int      result;


    result = T1_ToFixedArray( parser, 6, temp, 0 );

    if ( result < 6 )
    {
      parser->root.error = FT_THROW( Invalid_File_Format );
      return;
    }

    temp_scale = FT_ABS( temp[3] );

    if ( temp_scale == 0 )
    {
      FT_ERROR(( "t42_parse_font_matrix: invalid font matrix\n" ));
      parser->root.error = FT_THROW( Invalid_File_Format );
      return;
    }

    /* atypical case */
    if ( temp_scale != 0x10000L )
    {
      temp[0] = FT_DivFix( temp[0], temp_scale );
      temp[1] = FT_DivFix( temp[1], temp_scale );
      temp[2] = FT_DivFix( temp[2], temp_scale );
      temp[4] = FT_DivFix( temp[4], temp_scale );
      temp[5] = FT_DivFix( temp[5], temp_scale );
      temp[3] = temp[3] < 0 ? -0x10000L : 0x10000L;
    }

    matrix->xx = temp[0];
    matrix->yx = temp[1];
    matrix->xy = temp[2];
    matrix->yy = temp[3];

    if ( !FT_Matrix_Check( matrix ) )
    {
      FT_ERROR(( "t42_parse_font_matrix: invalid font matrix\n" ));
      parser->root.error = FT_THROW( Invalid_File_Format );
      return;
    }

    /* note that the offsets must be expressed in integer font units */
    offset->x = temp[4] >> 16;
    offset->y = temp[5] >> 16;
  }